

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O0

string * __thiscall
libcellml::GeneratorProfile::implementationInitialiseVariablesMethodString_abi_cxx11_
          (string *__return_storage_ptr__,GeneratorProfile *this,bool forDifferentialModel,
          bool withExternalVariables)

{
  bool withExternalVariables_local;
  bool forDifferentialModel_local;
  GeneratorProfile *this_local;
  
  if (forDifferentialModel) {
    if (withExternalVariables) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (string *)&this->mPimpl->mImplementationInitialiseVariablesMethodFdmWevString);
    }
    else {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (string *)&this->mPimpl->mImplementationInitialiseVariablesMethodFdmWoevString);
    }
  }
  else if (withExternalVariables) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)&this->mPimpl->mImplementationInitialiseVariablesMethodFamWevString);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)&this->mPimpl->mImplementationInitialiseVariablesMethodFamWoevString);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratorProfile::implementationInitialiseVariablesMethodString(bool forDifferentialModel,
                                                                            bool withExternalVariables) const
{
    if (forDifferentialModel) {
        if (withExternalVariables) {
            return mPimpl->mImplementationInitialiseVariablesMethodFdmWevString;
        }

        return mPimpl->mImplementationInitialiseVariablesMethodFdmWoevString;
    }

    if (withExternalVariables) {
        return mPimpl->mImplementationInitialiseVariablesMethodFamWevString;
    }

    return mPimpl->mImplementationInitialiseVariablesMethodFamWoevString;
}